

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,8>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,8>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>_>
                     *lhs,Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_> *rhs,
               sub *func,false_type *param_5)

{
  PointerType pfVar1;
  long lVar2;
  PointerType pfVar3;
  void *pvVar4;
  undefined8 this;
  Scalar *ptr;
  ulong uVar5;
  long lVar6;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
  *pBVar7;
  Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false> *pBVar8;
  XprTypeNested *pXVar9;
  long lVar10;
  byte bVar11;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
  local_138;
  undefined1 local_a0 [32];
  ObjectType local_80;
  void *local_68;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>_>,__1,_true>
  actual_lhs_wrapper;
  
  bVar11 = 0;
  pBVar7 = &local_138;
  uVar5 = (lhs->m_rhs).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_0>
          .m_rows.m_value * 4;
  if (uVar5 < 0x20001) {
    ptr = (Scalar *)((long)&local_138 - (uVar5 + 0x1e & 0xfffffffffffffff0));
    pBVar7 = (Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
              *)ptr;
  }
  else {
    ptr = (Scalar *)0x0;
  }
  pfVar1 = (rhs->
           super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_1>
           ).
           super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  actual_lhs_wrapper._24_8_ = func;
  *(Scalar *)((long)pBVar7 + -8) = 2.032676e-39;
  *(Scalar *)((long)pBVar7 + -4) = 0.0;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>_>,_-1,_true>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>_>,__1,_true>
              *)&local_68,lhs,ptr);
  pvVar4 = local_68;
  lVar2 = (dst->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value;
  if (0 < lVar2) {
    lVar10 = 0;
    do {
      pfVar3 = (dst->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
               .m_data;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_rows.m_value =
           (dst->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_data = pfVar3 + (((dst->
                           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                           ).
                           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
                           .m_xpr.
                           super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>
                          .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).
                         m_storage.m_rows * lVar10;
      if (local_138.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value < 0 && pfVar3 != (PointerType)0x0) {
        *(undefined1 **)((long)pBVar7 + -8) = &LAB_001623ab;
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>>>, -1, 1, true>, Level = 0]"
                     );
      }
      pBVar8 = dst;
      pXVar9 = &local_138.
                super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
                .m_xpr;
      for (lVar6 = 0xd; this = actual_lhs_wrapper._24_8_, lVar6 != 0; lVar6 = lVar6 + -1) {
        (pXVar9->
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
        ).
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
        .m_data = (pBVar8->
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
                  .m_data;
        pBVar8 = (Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>
                  *)((long)pBVar8 + ((ulong)bVar11 * -2 + 1) * 8);
        pXVar9 = (XprTypeNested *)((long)pXVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      }
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startRow.m_value = 0;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_outerStride =
           ((local_138.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>.m_xpr
            )->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.m_rows;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startCol.m_value = lVar10;
      if ((dst->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value <= lVar10) {
        *(Scalar *)((long)pBVar7 + -8) = 2.033133e-39;
        *(Scalar *)((long)pBVar7 + -4) = 0.0;
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if ((long)actual_lhs_wrapper.object._0_8_ < 0) {
        *(Scalar *)((long)pBVar7 + -8) = 2.033089e-39;
        *(Scalar *)((long)pBVar7 + -4) = 0.0;
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
                     );
      }
      local_a0._20_4_ = pfVar1[lVar10];
      local_a0._8_8_ = actual_lhs_wrapper.object._0_8_;
      local_a0._24_8_ = pvVar4;
      local_80._0_8_ = actual_lhs_wrapper.object._0_8_;
      local_80._8_1_ = actual_lhs_wrapper.object._8_1_;
      *(Scalar *)((long)pBVar7 + -8) = 2.032987e-39;
      *(Scalar *)((long)pBVar7 + -4) = 0.0;
      generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,1,true>,-1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,-1,1,1,8>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>
      ::sub::operator()((void *)this,&local_138,
                        (CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
                         *)local_a0);
      lVar10 = lVar10 + 1;
    } while (lVar2 != lVar10);
  }
  if (actual_lhs_wrapper.object._16_1_ == '\x01') {
    *(Scalar *)((long)pBVar7 + -8) = 2.033025e-39;
    *(Scalar *)((long)pBVar7 + -4) = 0.0;
    free(local_68);
  }
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}